

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
* testing::internal::
  ActionResultHolder<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>>
  ::
  PerformAction<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
            (Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
             *action,ArgumentTuple *args)

{
  ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
  *pAVar1;
  Result local_70;
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  local_50;
  ArgumentTuple local_30;
  
  pAVar1 = (ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
            *)operator_new(0x28);
  local_30.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>)
       (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
       super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
       super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl;
  local_30.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Head_base<0UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
       super__Head_base<0UL,_int,_false>._M_head_impl;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::Perform(&local_70,action,&local_30);
  local_50.has_error_ = true;
  pstore::
  error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
  ::
  move_construct<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
            ((error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
              *)&local_50,&local_70);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_001bb4c0;
  (pAVar1->result_).value_.has_error_ = true;
  pstore::
  error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
  ::
  move_construct<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
            ((error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
              *)&pAVar1->result_,&local_50);
  if (local_50.has_error_ == false) {
    pstore::
    error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
    ::
    value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
              (&local_50);
  }
  else {
    pstore::
    error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
              (&local_50);
  }
  if (local_70.has_error_ == false) {
    pstore::
    error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
    ::
    value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
              (&local_70);
  }
  else {
    pstore::
    error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
              (&local_70);
  }
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }